

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O1

sexp_conflict sexp_open_pipe_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  sexp_conflict res0;
  int tmp0 [2];
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_38;
  int local_30 [2];
  sexp_gc_var_t local_28;
  
  local_28.var = &local_38;
  local_38 = (sexp_conflict)0x43e;
  local_28.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_28;
  iVar1 = pipe(local_30);
  local_38 = (sexp_conflict)0x3e;
  if (iVar1 == 0) {
    local_38 = (sexp_conflict)0x23e;
    lVar3 = 1;
    do {
      sexp_push_op(ctx,&local_38,0x43e);
      dVar2 = (double)sexp_make_fileno_op(ctx,0,2,(long)local_30[lVar3] * 2 + 1,0x3e);
      (local_38->value).flonum = dVar2;
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
    } while (bVar4);
  }
  (ctx->value).context.saves = local_28.next;
  return local_38;
}

Assistant:

sexp sexp_open_pipe_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int i = 0, err = 0;
  int tmp0[2];
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  err = pipe(tmp0);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res0 = SEXP_NULL;
  for (i=2-1; i>=0; i--) {
    sexp_push(ctx, res0, SEXP_VOID);
    sexp_car(res0) = sexp_make_fileno(ctx, sexp_make_fixnum(tmp0[i]), SEXP_FALSE);
  }
  res = res0;
  }
  sexp_gc_release1(ctx);
  return res;
}